

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

void If_Dec7MinimumBase(word *uTruth,int *pSupp,int nVarsAll,int *pnVars)

{
  int iVar1;
  uint local_34;
  int local_30;
  int uSupp;
  int iVar;
  int v;
  int *pnVars_local;
  int nVarsAll_local;
  int *pSupp_local;
  word *uTruth_local;
  
  local_30 = 0;
  local_34 = 0;
  if (7 < nVarsAll) {
    __assert_fail("nVarsAll <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x223,"void If_Dec7MinimumBase(word *, int *, int, int *)");
  }
  for (uSupp = 0; uSupp < nVarsAll; uSupp = uSupp + 1) {
    iVar1 = If_Dec7HasVar(uTruth,uSupp);
    if (iVar1 != 0) {
      local_34 = 1 << ((byte)uSupp & 0x1f) | local_34;
      if (pSupp != (int *)0x0) {
        pSupp[local_30] = pSupp[uSupp];
      }
      local_30 = local_30 + 1;
    }
  }
  if (pnVars != (int *)0x0) {
    *pnVars = local_30;
  }
  iVar1 = If_DecSuppIsMinBase(local_34);
  if (iVar1 == 0) {
    If_Dec7TruthShrink(uTruth,local_30,nVarsAll,local_34);
  }
  return;
}

Assistant:

void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 7 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_Dec7HasVar( uTruth, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_DecSuppIsMinBase( uSupp ) )
        return;
    If_Dec7TruthShrink( uTruth, iVar, nVarsAll, uSupp );
}